

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int array_container_intersection_cardinality(array_container_t *array1,array_container_t *array2)

{
  int iVar1;
  undefined1 (*A) [16];
  undefined1 (*B) [16];
  long lVar2;
  undefined1 auVar3 [16];
  int32_t iVar4;
  ulong uVar5;
  ulong lenB;
  int iVar6;
  ulong lenA;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined4 in_XMM0_Da;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  
  iVar6 = array1->cardinality;
  lenA = (ulong)iVar6;
  iVar1 = array2->cardinality;
  lenB = (ulong)iVar1;
  if (iVar6 * 0x40 < iVar1) {
    iVar4 = intersect_skewed_uint16_cardinality(array1->array,lenA,array2->array,lenB);
    return iVar4;
  }
  if (iVar1 * 0x40 < iVar6) {
    iVar4 = intersect_skewed_uint16_cardinality(array2->array,lenB,array1->array,lenA);
    return iVar4;
  }
  lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
  A = (undefined1 (*) [16])array1->array;
  B = (undefined1 (*) [16])array2->array;
  if ((*(uint *)(lVar2 + 4) & 0x20) == 0) {
    iVar4 = intersect_uint16_cardinality((uint16_t *)A,lenA,(uint16_t *)B,lenB);
    return iVar4;
  }
  uVar5 = lenA & 0xfffffffffffffff8;
  uVar12 = lenB & 0xfffffffffffffff8;
  if (uVar12 == 0 || uVar5 == 0) {
    iVar6 = 0;
    uVar8 = 0;
    uVar11 = 0;
  }
  else {
    auVar3 = vlddqu_avx(*A);
    auVar13 = ZEXT1664(auVar3);
    auVar3 = vlddqu_avx(*B);
    auVar14 = ZEXT1664(auVar3);
    iVar6 = 0;
    uVar7 = 0;
    uVar10 = 0;
    while ((uVar8 = uVar7, *(short *)(*A + uVar10 * 2) == 0 || (*(short *)(*B + uVar7 * 2) == 0))) {
      vpcmpestrm_avx(auVar14._0_16_,auVar13._0_16_,1);
      iVar6 = iVar6 + POPCOUNT(in_XMM0_Da);
      lVar2 = uVar10 * 2;
      uVar9 = uVar10;
      if (*(ushort *)(*A + lVar2 + 0xe) <= *(ushort *)(*B + uVar7 * 2 + 0xe)) {
        uVar9 = uVar10 + 8;
        uVar11 = uVar5;
        if (uVar9 == uVar5) goto LAB_001019cd;
        auVar3 = vlddqu_avx(*(undefined1 (*) [16])(A[1] + uVar10 * 2));
        auVar13 = ZEXT1664(auVar3);
      }
      uVar10 = uVar9;
      if (*(ushort *)(*B + uVar7 * 2 + 0xe) <= *(ushort *)(*A + lVar2 + 0xe)) {
        uVar8 = uVar12;
        uVar11 = uVar9;
        if (uVar7 + 8 == uVar12) goto LAB_001019cd;
        auVar3 = vlddqu_avx(*(undefined1 (*) [16])(B[1] + uVar7 * 2));
        auVar14 = ZEXT1664(auVar3);
        uVar7 = uVar7 + 8;
      }
    }
    uVar11 = uVar10;
    if (uVar7 < uVar12 && uVar10 < uVar5) {
      while( true ) {
        uVar9 = uVar10;
        do {
          vpcmpistrm_avx(auVar14._0_16_,auVar13._0_16_,1);
          iVar6 = POPCOUNT(in_XMM0_Da) + iVar6;
          lVar2 = uVar9 * 2;
          uVar10 = uVar9;
          if (*(ushort *)(*A + lVar2 + 0xe) <= *(ushort *)(*B + uVar7 * 2 + 0xe)) {
            uVar10 = uVar9 + 8;
            uVar8 = uVar7;
            uVar11 = uVar5;
            if (uVar10 == uVar5) goto LAB_001019cd;
            auVar3 = vlddqu_avx(*(undefined1 (*) [16])(A[1] + uVar9 * 2));
            auVar13 = ZEXT1664(auVar3);
          }
          uVar9 = uVar10;
        } while (*(ushort *)(*A + lVar2 + 0xe) < *(ushort *)(*B + uVar7 * 2 + 0xe));
        uVar8 = uVar12;
        uVar11 = uVar10;
        if (uVar7 + 8 == uVar12) break;
        auVar3 = vlddqu_avx(*(undefined1 (*) [16])(B[1] + uVar7 * 2));
        auVar14 = ZEXT1664(auVar3);
        uVar7 = uVar7 + 8;
      }
    }
  }
LAB_001019cd:
  if (uVar8 < lenB && uVar11 < lenA) {
    do {
      if (*(ushort *)(*A + uVar11 * 2) < *(ushort *)(*B + uVar8 * 2)) {
        uVar11 = uVar11 + 1;
      }
      else {
        if (*(ushort *)(*A + uVar11 * 2) <= *(ushort *)(*B + uVar8 * 2)) {
          iVar6 = iVar6 + 1;
          uVar11 = uVar11 + 1;
        }
        uVar8 = uVar8 + 1;
      }
    } while ((uVar11 < lenA) && (uVar8 < lenB));
  }
  return iVar6;
}

Assistant:

int array_container_intersection_cardinality(const array_container_t *array1,
                                             const array_container_t *array2) {
    int32_t card_1 = array1->cardinality, card_2 = array2->cardinality;
    const int threshold = 64;  // subject to tuning
    if (card_1 * threshold < card_2) {
        return intersect_skewed_uint16_cardinality(array1->array, card_1,
                                                   array2->array, card_2);
    } else if (card_2 * threshold < card_1) {
        return intersect_skewed_uint16_cardinality(array2->array, card_2,
                                                   array1->array, card_1);
    } else {
#ifdef CROARING_IS_X64
    if( croaring_avx2() ) {
        return intersect_vector16_cardinality(array1->array, card_1,
                                              array2->array, card_2);
    } else {
        return intersect_uint16_cardinality(array1->array, card_1,
                                            array2->array, card_2);
    }
#else
        return intersect_uint16_cardinality(array1->array, card_1,
                                            array2->array, card_2);
#endif
    }
}